

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O3

REF_STATUS ref_acceptance_q(REF_NODE ref_node,char *function_name,REF_INT *ldim,REF_DBL **scalar)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  uint uVar4;
  REF_DBL *pRVar5;
  long lVar6;
  int iVar7;
  REF_STATUS RVar8;
  long lVar9;
  undefined1 auVar10 [16];
  long lVar11;
  REF_DBL primitive [6];
  REF_DBL local_78;
  REF_DBL RStack_70;
  REF_DBL local_68;
  REF_DBL RStack_60;
  REF_DBL local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  *ldim = 5;
  iVar2 = strcmp(function_name,"fp-sa");
  iVar7 = (iVar2 == 0) + 5;
  *ldim = iVar7;
  iVar3 = strcmp(function_name,"sst");
  iVar2 = 7;
  if (iVar3 != 0) {
    iVar2 = iVar7;
  }
  *ldim = iVar2;
  iVar3 = ref_node->max;
  uVar4 = iVar2 * iVar3;
  if ((int)uVar4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
           0x1aa,"ref_acceptance_q","malloc *scalar of REF_DBL negative");
LAB_00110b6a:
    RVar8 = 1;
  }
  else {
    pRVar5 = (REF_DBL *)malloc((ulong)uVar4 << 3);
    *scalar = pRVar5;
    if (pRVar5 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
             0x1aa,"ref_acceptance_q","malloc *scalar of REF_DBL NULL");
      RVar8 = 2;
    }
    else {
      if (0 < iVar3) {
        lVar9 = 0;
        local_48 = -0x80000000;
        uStack_44 = 0x80000000;
        uStack_40 = 0x80000000;
        uStack_3c = 0x80000000;
        do {
          if (-1 < ref_node->global[lVar9]) {
            iVar3 = strcmp(function_name,"trig");
            iVar7 = (int)lVar9;
            if (iVar3 == 0) {
              ref_acceptance_primal_trig
                        (ref_node->real[lVar9 * 0xf],ref_node->real[lVar9 * 0xf + 1],&local_78);
LAB_00110aaa:
              pRVar5 = *scalar;
              iVar2 = *ldim;
              lVar6 = (long)(iVar7 * iVar2);
              pRVar5[lVar6 + 4] = local_58;
            }
            else {
              iVar3 = strcmp(function_name,"vortex");
              if (iVar3 == 0) {
                ref_acceptance_primal_vortex
                          (ref_node->real[lVar9 * 0xf],ref_node->real[lVar9 * 0xf + 1],&local_78);
                goto LAB_00110aaa;
              }
              iVar3 = strcmp(function_name,"coax");
              if (iVar3 == 0) {
                ref_acceptance_primal_coax
                          (ref_node->real[lVar9 * 0xf],ref_node->real[lVar9 * 0xf + 1],&local_78);
                goto LAB_00110aaa;
              }
              iVar3 = strcmp(function_name,"ringleb");
              if (iVar3 == 0) {
                uVar4 = ref_acceptance_primal_ringleb
                                  (ref_node->real[lVar9 * 0xf],ref_node->real[lVar9 * 0xf + 1],
                                   &local_78);
                if (uVar4 == 0) goto LAB_00110aaa;
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                       ,0x1cb,"ref_acceptance_q",(ulong)uVar4,"ringleb");
                goto LAB_00110b6a;
              }
              iVar3 = strcmp(function_name,"fp-sa");
              if (iVar3 != 0) {
                iVar3 = strcmp(function_name,"sst");
                auVar1 = _DAT_00211220;
                if (iVar3 != 0) {
                  printf("%s: %d: %s %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                         ,0x1d8,"unknown user function",function_name);
                  return 5;
                }
                lVar6 = 0;
                auVar10 = _DAT_00211210;
                do {
                  lVar11 = auVar10._8_8_;
                  if (SUB164(auVar10 ^ auVar1,4) == local_48 &&
                      SUB164(auVar10 ^ auVar1,0) < -0x7ffffff9) {
                    pRVar5[iVar2 * iVar7 + lVar6] = (double)(int)(auVar10._0_8_ + 1);
                    pRVar5[(long)(iVar2 * iVar7) + lVar6 + 1] = (double)(int)(lVar11 + 1);
                  }
                  lVar6 = lVar6 + 2;
                  auVar10._0_8_ = auVar10._0_8_ + 2;
                  auVar10._8_8_ = lVar11 + 2;
                } while (lVar6 != 8);
                goto LAB_00110ae0;
              }
              uVar4 = ref_acceptance_primal_fp_sa(ref_node->real[lVar9 * 0xf + 1],&local_78);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                       ,0x1d2,"ref_acceptance_q",(ulong)uVar4,"flat plate sa");
                return uVar4;
              }
              pRVar5 = *scalar;
              iVar2 = *ldim;
              lVar6 = (long)(iVar7 * iVar2);
              auVar1._8_8_ = uStack_50;
              auVar1._0_8_ = local_58;
              *(undefined1 (*) [16])(pRVar5 + lVar6 + 4) = auVar1;
            }
            pRVar5[lVar6 + 2] = local_68;
            (pRVar5 + lVar6 + 2)[1] = RStack_60;
            pRVar5[lVar6] = local_78;
            (pRVar5 + lVar6)[1] = RStack_70;
          }
LAB_00110ae0:
          lVar9 = lVar9 + 1;
        } while (lVar9 < ref_node->max);
      }
      RVar8 = 0;
    }
  }
  return RVar8;
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_q(REF_NODE ref_node,
                                           const char *function_name,
                                           REF_INT *ldim, REF_DBL **scalar) {
  REF_INT node;

  *ldim = 5;
  if (strcmp(function_name, "fp-sa") == 0) {
    *ldim = 6;
  }
  if (strcmp(function_name, "sst") == 0) {
    *ldim = 7;
  }
  ref_malloc(*scalar, (*ldim) * ref_node_max(ref_node), REF_DBL);

  each_ref_node_valid_node(ref_node, node) {
    if (strcmp(function_name, "trig") == 0) {
      REF_INT i;
      REF_DBL primitive[5];
      RSS(ref_acceptance_primal_trig(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "trig");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "vortex") == 0) {
      REF_INT i;
      REF_DBL primitive[5];
      RSS(ref_acceptance_primal_vortex(ref_node_xyz(ref_node, 0, node),
                                       ref_node_xyz(ref_node, 1, node),
                                       primitive),
          "vortex");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "coax") == 0) {
      REF_INT i;
      REF_DBL primitive[5];
      RSS(ref_acceptance_primal_coax(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "coax");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "ringleb") == 0) {
      REF_INT i;
      REF_DBL primitive[5];
      RSS(ref_acceptance_primal_ringleb(ref_node_xyz(ref_node, 0, node),
                                        ref_node_xyz(ref_node, 1, node),
                                        primitive),
          "ringleb");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "fp-sa") == 0) {
      REF_INT i;
      REF_DBL primitive[6];
      RSS(ref_acceptance_primal_fp_sa(ref_node_xyz(ref_node, 1, node),
                                      primitive),
          "flat plate sa");
      for (i = 0; i < 6; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "sst") == 0) {
      REF_INT i;
      for (i = 0; i < 7; i++) (*scalar)[i + (*ldim) * node] = (REF_DBL)(i + 1);
    } else {
      printf("%s: %d: %s %s\n", __FILE__, __LINE__, "unknown user function",
             function_name);
      return REF_NOT_FOUND;
    }
  }
  return REF_SUCCESS;
}